

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_signal_del_(event_base *base,int sig,event *ev)

{
  eventop *peVar1;
  long *plVar2;
  int iVar3;
  evmap_signal *ctx;
  event_signal_map *map;
  eventop *evsel;
  event *ev_local;
  int sig_local;
  event_base *base_local;
  
  peVar1 = base->evsigsel;
  if ((sig < 0) || ((base->sigmap).nentries <= sig)) {
    base_local._4_4_ = -1;
  }
  else {
    plVar2 = (long *)(base->sigmap).entries[sig];
    if ((ev->ev_).ev_io.ev_io_next.le_next != (event *)0x0) {
      (((ev->ev_).ev_io.ev_io_next.le_next)->ev_).ev_io.ev_io_next.le_prev =
           (ev->ev_).ev_io.ev_io_next.le_prev;
    }
    *(ev->ev_).ev_io.ev_io_next.le_prev = (ev->ev_).ev_io.ev_io_next.le_next;
    if ((*plVar2 == 0) && (iVar3 = (*peVar1->del)(base,ev->ev_fd,0,8,(void *)0x0), iVar3 == -1)) {
      base_local._4_4_ = -1;
    }
    else {
      base_local._4_4_ = 1;
    }
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_signal_del_(struct event_base *base, int sig, struct event *ev)
{
	const struct eventop *evsel = base->evsigsel;
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx;

	if (sig < 0 || sig >= map->nentries)
		return (-1);

	GET_SIGNAL_SLOT(ctx, map, sig, evmap_signal);

	LIST_REMOVE(ev, ev_signal_next);

	if (LIST_FIRST(&ctx->events) == NULL) {
		if (evsel->del(base, ev->ev_fd, 0, EV_SIGNAL, NULL) == -1)
			return (-1);
	}

	return (1);
}